

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
* __thiscall
google::protobuf::anon_unknown_24::
FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::Pointers(TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *__return_storage_ptr__,
          FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          *this)

{
  initializer_list<google::protobuf::(anonymous_namespace)::ExpressionEater> iVar1;
  char *pcVar2;
  PointerT<char> *ppcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  PointerT<std::__cxx11::basic_string<char>_> *ppbVar5;
  SourceCodeInfo *pSVar6;
  PointerT<google::protobuf::SourceCodeInfo> *ppSVar7;
  FileDescriptorTables *pFVar8;
  PointerT<google::protobuf::FileDescriptorTables> *ppFVar9;
  FeatureSet *pFVar10;
  PointerT<google::protobuf::FeatureSet> *ppFVar11;
  MessageOptions *pMVar12;
  PointerT<google::protobuf::MessageOptions> *ppMVar13;
  FieldOptions *pFVar14;
  PointerT<google::protobuf::FieldOptions> *ppFVar15;
  EnumOptions *pEVar16;
  PointerT<google::protobuf::EnumOptions> *ppEVar17;
  EnumValueOptions *pEVar18;
  PointerT<google::protobuf::EnumValueOptions> *ppEVar19;
  ExtensionRangeOptions *pEVar20;
  PointerT<google::protobuf::ExtensionRangeOptions> *ppEVar21;
  OneofOptions *pOVar22;
  PointerT<google::protobuf::OneofOptions> *ppOVar23;
  ServiceOptions *pSVar24;
  PointerT<google::protobuf::ServiceOptions> *ppSVar25;
  MethodOptions *pMVar26;
  PointerT<google::protobuf::MethodOptions> *ppMVar27;
  FileOptions *pFVar28;
  PointerT<google::protobuf::FileOptions> *ppFVar29;
  TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *out;
  ExpressionEater local_2e;
  ExpressionEater EStack_2d;
  ExpressionEater EStack_2c;
  ExpressionEater EStack_2b;
  ExpressionEater EStack_2a;
  ExpressionEater EStack_29;
  ExpressionEater EStack_28;
  ExpressionEater EStack_27;
  ExpressionEater EStack_26;
  ExpressionEater EStack_25;
  ExpressionEater EStack_24;
  ExpressionEater EStack_23;
  ExpressionEater EStack_22;
  ExpressionEater EStack_21;
  iterator local_20;
  undefined8 local_18;
  FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_10;
  FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  
  local_10 = this;
  TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::TypeMap(__return_storage_ptr__);
  pcVar2 = Begin<char>(this);
  ppcVar3 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<char>(__return_storage_ptr__);
  *ppcVar3 = pcVar2;
  protobuf::(anonymous_namespace)::ExpressionEater::ExpressionEater<char*&>(&local_2e,ppcVar3);
  pbVar4 = protobuf::(anonymous_namespace)::
           FlatAllocation<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           ::Begin<std::__cxx11::string>
                     ((FlatAllocation<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                       *)this);
  ppbVar5 = protobuf::(anonymous_namespace)::
            TypeMap<google::protobuf::(anonymous_namespace)::PointerT,char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::Get<std::__cxx11::string>
                      ((TypeMap<google::protobuf::(anonymous_namespace)::PointerT,char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        *)__return_storage_ptr__);
  *ppbVar5 = pbVar4;
  protobuf::(anonymous_namespace)::ExpressionEater::ExpressionEater<std::__cxx11::string*&>
            (&EStack_2d,ppbVar5);
  pSVar6 = Begin<google::protobuf::SourceCodeInfo>(this);
  ppSVar7 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::SourceCodeInfo>(__return_storage_ptr__);
  *ppSVar7 = pSVar6;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::SourceCodeInfo*&>(&EStack_2c,ppSVar7);
  pFVar8 = Begin<google::protobuf::FileDescriptorTables>(this);
  ppFVar9 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::Get<google::protobuf::FileDescriptorTables>(__return_storage_ptr__);
  *ppFVar9 = pFVar8;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::FileDescriptorTables*&>(&EStack_2b,ppFVar9);
  pFVar10 = Begin<google::protobuf::FeatureSet>(this);
  ppFVar11 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::FeatureSet>(__return_storage_ptr__);
  *ppFVar11 = pFVar10;
  protobuf::(anonymous_namespace)::ExpressionEater::ExpressionEater<google::protobuf::FeatureSet*&>
            (&EStack_2a,ppFVar11);
  pMVar12 = Begin<google::protobuf::MessageOptions>(this);
  ppMVar13 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::MessageOptions>(__return_storage_ptr__);
  *ppMVar13 = pMVar12;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::MessageOptions*&>(&EStack_29,ppMVar13);
  pFVar14 = Begin<google::protobuf::FieldOptions>(this);
  ppFVar15 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::FieldOptions>(__return_storage_ptr__);
  *ppFVar15 = pFVar14;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::FieldOptions*&>(&EStack_28,ppFVar15);
  pEVar16 = Begin<google::protobuf::EnumOptions>(this);
  ppEVar17 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::EnumOptions>(__return_storage_ptr__);
  *ppEVar17 = pEVar16;
  protobuf::(anonymous_namespace)::ExpressionEater::ExpressionEater<google::protobuf::EnumOptions*&>
            (&EStack_27,ppEVar17);
  pEVar18 = Begin<google::protobuf::EnumValueOptions>(this);
  ppEVar19 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::EnumValueOptions>(__return_storage_ptr__);
  *ppEVar19 = pEVar18;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::EnumValueOptions*&>(&EStack_26,ppEVar19);
  pEVar20 = Begin<google::protobuf::ExtensionRangeOptions>(this);
  ppEVar21 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::ExtensionRangeOptions>(__return_storage_ptr__);
  *ppEVar21 = pEVar20;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::ExtensionRangeOptions*&>(&EStack_25,ppEVar21);
  pOVar22 = Begin<google::protobuf::OneofOptions>(this);
  ppOVar23 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::OneofOptions>(__return_storage_ptr__);
  *ppOVar23 = pOVar22;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::OneofOptions*&>(&EStack_24,ppOVar23);
  pSVar24 = Begin<google::protobuf::ServiceOptions>(this);
  ppSVar25 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::ServiceOptions>(__return_storage_ptr__);
  *ppSVar25 = pSVar24;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::ServiceOptions*&>(&EStack_23,ppSVar25);
  pMVar26 = Begin<google::protobuf::MethodOptions>(this);
  ppMVar27 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::MethodOptions>(__return_storage_ptr__);
  *ppMVar27 = pMVar26;
  protobuf::(anonymous_namespace)::ExpressionEater::
  ExpressionEater<google::protobuf::MethodOptions*&>(&EStack_22,ppMVar27);
  pFVar28 = Begin<google::protobuf::FileOptions>(this);
  ppFVar29 = TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::Get<google::protobuf::FileOptions>(__return_storage_ptr__);
  *ppFVar29 = pFVar28;
  protobuf::(anonymous_namespace)::ExpressionEater::ExpressionEater<google::protobuf::FileOptions*&>
            (&EStack_21,ppFVar29);
  local_20 = (iterator)&local_2e;
  local_18 = 0xe;
  iVar1._M_len = 0xe;
  iVar1._M_array = local_20;
  Fold(iVar1);
  return __return_storage_ptr__;
}

Assistant:

TypeMap<PointerT, T...> Pointers() const {
    TypeMap<PointerT, T...> out;
    Fold({(out.template Get<T>() = Begin<T>())...});
    return out;
  }